

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_write_certificate(mbedtls_ssl_context *ssl)

{
  long lVar1;
  mbedtls_key_exchange_type_t mVar2;
  mbedtls_ssl_config *pmVar3;
  ulong __n;
  int iVar4;
  mbedtls_ssl_key_cert *pmVar5;
  size_t sVar6;
  mbedtls_x509_crt *pmVar7;
  
  mVar2 = ssl->transform_negotiate->ciphersuite_info->key_exchange;
  if ((mVar2 < (MBEDTLS_KEY_EXCHANGE_ECDHE_PSK|MBEDTLS_KEY_EXCHANGE_ECDHE_ECDSA)) &&
     ((0x960U >> (mVar2 & 0x1f) & 1) != 0)) {
LAB_0011460d:
    ssl->state = ssl->state + 1;
    iVar4 = 0;
  }
  else {
    pmVar3 = ssl->conf;
    if ((*(uint *)&pmVar3->field_0x174 & 1) == 0) {
      if (ssl->client_auth == 0) goto LAB_0011460d;
      if ((*(uint *)&pmVar3->field_0x174 & 1) != 0) goto LAB_00114639;
    }
    else {
LAB_00114639:
      if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
         (pmVar5 = ssl->handshake->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
        pmVar5 = pmVar3->key_cert;
      }
      if (pmVar5 == (mbedtls_ssl_key_cert *)0x0) {
        return -0x7580;
      }
      if (pmVar5->cert == (mbedtls_x509_crt *)0x0) {
        return -0x7580;
      }
    }
    if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
       (pmVar5 = ssl->handshake->key_cert, pmVar5 == (mbedtls_ssl_key_cert *)0x0)) {
      pmVar5 = pmVar3->key_cert;
    }
    if (pmVar5 == (mbedtls_ssl_key_cert *)0x0) {
      pmVar7 = (mbedtls_x509_crt *)0x0;
    }
    else {
      pmVar7 = pmVar5->cert;
    }
    sVar6 = 7;
    while( true ) {
      if (pmVar7 == (mbedtls_x509_crt *)0x0) {
        lVar1 = sVar6 - 7;
        ssl->out_msg[4] = (uchar)((ulong)lVar1 >> 0x10);
        ssl->out_msg[5] = (uchar)((ulong)lVar1 >> 8);
        ssl->out_msg[6] = (uchar)lVar1;
        ssl->out_msglen = sVar6;
        ssl->out_msgtype = 0x16;
        *ssl->out_msg = '\v';
        ssl->state = ssl->state + 1;
        iVar4 = mbedtls_ssl_write_record(ssl);
        return iVar4;
      }
      __n = (pmVar7->raw).len;
      if (0x3ffd - sVar6 < __n) break;
      ssl->out_msg[sVar6] = (uchar)(__n >> 0x10);
      ssl->out_msg[sVar6 + 1] = (uchar)(__n >> 8);
      ssl->out_msg[sVar6 + 2] = (uchar)__n;
      memcpy(ssl->out_msg + sVar6 + 3,(pmVar7->raw).p,__n);
      sVar6 = sVar6 + __n + 3;
      pmVar7 = pmVar7->next;
    }
    iVar4 = -0x7500;
  }
  return iVar4;
}

Assistant:

int mbedtls_ssl_write_certificate( mbedtls_ssl_context *ssl )
{
    int ret = MBEDTLS_ERR_SSL_FEATURE_UNAVAILABLE;
    size_t i, n;
    const mbedtls_x509_crt *crt;
    const mbedtls_ssl_ciphersuite_t *ciphersuite_info = ssl->transform_negotiate->ciphersuite_info;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write certificate" ) );

    if( ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_DHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECDHE_PSK ||
        ciphersuite_info->key_exchange == MBEDTLS_KEY_EXCHANGE_ECJPAKE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write certificate" ) );
        ssl->state++;
        return( 0 );
    }

#if defined(MBEDTLS_SSL_CLI_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT )
    {
        if( ssl->client_auth == 0 )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= skip write certificate" ) );
            ssl->state++;
            return( 0 );
        }

#if defined(MBEDTLS_SSL_PROTO_SSL3)
        /*
         * If using SSLv3 and got no cert, send an Alert message
         * (otherwise an empty Certificate message will be sent).
         */
        if( mbedtls_ssl_own_cert( ssl )  == NULL &&
            ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
        {
            ssl->out_msglen  = 2;
            ssl->out_msgtype = MBEDTLS_SSL_MSG_ALERT;
            ssl->out_msg[0]  = MBEDTLS_SSL_ALERT_LEVEL_WARNING;
            ssl->out_msg[1]  = MBEDTLS_SSL_ALERT_MSG_NO_CERT;

            MBEDTLS_SSL_DEBUG_MSG( 2, ( "got no certificate to send" ) );
            goto write_msg;
        }
#endif /* MBEDTLS_SSL_PROTO_SSL3 */
    }
#endif /* MBEDTLS_SSL_CLI_C */
#if defined(MBEDTLS_SSL_SRV_C)
    if( ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER )
    {
        if( mbedtls_ssl_own_cert( ssl ) == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no certificate to send" ) );
            return( MBEDTLS_ERR_SSL_CERTIFICATE_REQUIRED );
        }
    }
#endif

    MBEDTLS_SSL_DEBUG_CRT( 3, "own certificate", mbedtls_ssl_own_cert( ssl ) );

    /*
     *     0  .  0    handshake type
     *     1  .  3    handshake length
     *     4  .  6    length of all certs
     *     7  .  9    length of cert. 1
     *    10  . n-1   peer certificate
     *     n  . n+2   length of cert. 2
     *    n+3 . ...   upper level cert, etc.
     */
    i = 7;
    crt = mbedtls_ssl_own_cert( ssl );

    while( crt != NULL )
    {
        n = crt->raw.len;
        if( n > MBEDTLS_SSL_MAX_CONTENT_LEN - 3 - i )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "certificate too large, %d > %d",
                           i + 3 + n, MBEDTLS_SSL_MAX_CONTENT_LEN ) );
            return( MBEDTLS_ERR_SSL_CERTIFICATE_TOO_LARGE );
        }

        ssl->out_msg[i    ] = (unsigned char)( n >> 16 );
        ssl->out_msg[i + 1] = (unsigned char)( n >>  8 );
        ssl->out_msg[i + 2] = (unsigned char)( n       );

        i += 3; memcpy( ssl->out_msg + i, crt->raw.p, n );
        i += n; crt = crt->next;
    }

    ssl->out_msg[4]  = (unsigned char)( ( i - 7 ) >> 16 );
    ssl->out_msg[5]  = (unsigned char)( ( i - 7 ) >>  8 );
    ssl->out_msg[6]  = (unsigned char)( ( i - 7 )       );

    ssl->out_msglen  = i;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_CERTIFICATE;

#if defined(MBEDTLS_SSL_PROTO_SSL3) && defined(MBEDTLS_SSL_CLI_C)
write_msg:
#endif

    ssl->state++;

    if( ( ret = mbedtls_ssl_write_record( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_write_record", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write certificate" ) );

    return( ret );
}